

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

int __thiscall
JsUtil::
List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Add(List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    *this,PropertyRecord **item)

{
  int iVar1;
  
  EnsureArray(this);
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
            ((this->
             super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr +
             (this->
             super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).
             count,*item);
  iVar1 = (this->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).
          count;
  (this->super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::Recycler,_DefaultComparer>).count =
       iVar1 + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }